

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void lzma_sha256_init(lzma_check_state *check)

{
  uint32_t *puVar1;
  
  puVar1 = (uint32_t *)((long)&check->state + 0x10);
  puVar1[0] = 0x510e527f;
  puVar1[1] = 0x9b05688c;
  puVar1 = (uint32_t *)((long)&check->state + 0x18);
  puVar1[0] = 0x1f83d9ab;
  puVar1[1] = 0x5be0cd19;
  (check->state).crc64 = 0xbb67ae856a09e667;
  puVar1 = (uint32_t *)((long)&check->state + 8);
  puVar1[0] = 0x3c6ef372;
  puVar1[1] = 0xa54ff53a;
  (check->state).sha256.size = 0;
  return;
}

Assistant:

extern void
lzma_sha256_init(lzma_check_state *check)
{
	static const uint32_t s[8] = {
		0x6A09E667, 0xBB67AE85, 0x3C6EF372, 0xA54FF53A,
		0x510E527F, 0x9B05688C, 0x1F83D9AB, 0x5BE0CD19,
	};

	memcpy(check->state.sha256.state, s, sizeof(s));
	check->state.sha256.size = 0;

	return;
}